

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O0

void __thiscall
Js::LocalsWalker::ExpandArgumentsObject
          (LocalsWalker *this,IDiagObjectModelDisplay *argumentsDisplay)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  undefined4 *puVar4;
  undefined4 extraout_var;
  IDiagObjectModelWalkerBase *pIVar5;
  uint local_74;
  undefined1 local_70 [4];
  int i;
  ResolvedObject tempResolvedObj;
  int count;
  IDiagObjectModelWalkerBase *walker;
  WeakArenaReference<Js::IDiagObjectModelWalkerBase> *argumentsObjectWalkerRef;
  IDiagObjectModelDisplay *argumentsDisplay_local;
  LocalsWalker *this_local;
  WeakArenaReference<Js::IDiagObjectModelWalkerBase> *this_00;
  
  if (argumentsDisplay == (IDiagObjectModelDisplay *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                ,0x635,"(argumentsDisplay != nullptr)","argumentsDisplay != nullptr"
                               );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  iVar3 = (*argumentsDisplay->_vptr_IDiagObjectModelDisplay[7])();
  this_00 = (WeakArenaReference<Js::IDiagObjectModelWalkerBase> *)CONCAT44(extraout_var,iVar3);
  if (this_00 == (WeakArenaReference<Js::IDiagObjectModelWalkerBase> *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                ,0x638,"(argumentsObjectWalkerRef != nullptr)",
                                "argumentsObjectWalkerRef != nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  pIVar5 = Memory::WeakArenaReference<Js::IDiagObjectModelWalkerBase>::GetStrongReference(this_00);
  tempResolvedObj._60_4_ = (*pIVar5->_vptr_IDiagObjectModelWalkerBase[1])();
  ResolvedObject::ResolvedObject((ResolvedObject *)local_70);
  for (local_74 = 0; (int)local_74 < (int)tempResolvedObj._60_4_; local_74 = local_74 + 1) {
    (**pIVar5->_vptr_IDiagObjectModelWalkerBase)(pIVar5,(ulong)local_74,local_70);
  }
  Memory::WeakArenaReference<Js::IDiagObjectModelWalkerBase>::ReleaseStrongReference(this_00);
  Memory::
  DeleteObject<Memory::HeapAllocator,(Memory::AllocatorDeleteFlags)0,Memory::WeakArenaReference<Js::IDiagObjectModelWalkerBase>>
            (&Memory::HeapAllocator::Instance,this_00);
  return;
}

Assistant:

void LocalsWalker::ExpandArgumentsObject(IDiagObjectModelDisplay * argumentsDisplay)
    {
        Assert(argumentsDisplay != nullptr);

        WeakArenaReference<Js::IDiagObjectModelWalkerBase>* argumentsObjectWalkerRef = argumentsDisplay->CreateWalker();
        Assert(argumentsObjectWalkerRef != nullptr);

        IDiagObjectModelWalkerBase * walker = argumentsObjectWalkerRef->GetStrongReference();
        int count = (int)walker->GetChildrenCount();
        Js::ResolvedObject tempResolvedObj;
        for (int i = 0; i < count; i++)
        {
            walker->Get(i, &tempResolvedObj);
        }
        argumentsObjectWalkerRef->ReleaseStrongReference();
        HeapDelete(argumentsObjectWalkerRef);
    }